

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::CommandReenroll
          (CommissionerSafe *this,ErrorHandler *aHandler,string *aDstAddr)

{
  anon_class_72_3_43e17e2a local_88;
  AsyncRequest local_40;
  string *local_20;
  string *aDstAddr_local;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_88.this = this;
  local_20 = aDstAddr;
  aDstAddr_local = (string *)aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_88.aHandler,aHandler);
  std::__cxx11::string::string((string *)&local_88.aDstAddr,(string *)local_20);
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::CommandReenroll(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&)::__0,void>
            ((function<void()> *)&local_40,&local_88);
  PushAsyncRequest(this,&local_40);
  std::function<void_()>::~function(&local_40);
  CommandReenroll(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&)::$_0::
  ~__0((__0 *)&local_88);
  return;
}

Assistant:

void CommissionerSafe::CommandReenroll(ErrorHandler aHandler, const std::string &aDstAddr)
{
    PushAsyncRequest([=]() { mImpl->CommandReenroll(aHandler, aDstAddr); });
}